

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.hpp
# Opt level: O0

int util::load<int,util::little_endian>(istream *is,size_t bits)

{
  char cVar1;
  short sVar2;
  long in_RSI;
  istream *in_RDI;
  undefined4 local_4;
  
  if (in_RSI == 8) {
    cVar1 = load<signed_char,util::little_endian>(in_RDI);
    local_4 = (int)cVar1;
  }
  else if (in_RSI == 0x10) {
    sVar2 = load<short,util::little_endian>(in_RDI);
    local_4 = (int)sVar2;
  }
  else if (in_RSI == 0x20) {
    local_4 = load<int,util::little_endian>(in_RDI);
  }
  else {
    local_4 = load<int,util::little_endian>(in_RDI);
  }
  return local_4;
}

Assistant:

T load(std::istream & is, size_t bits) {
	if(bits == 8) {
		return load<typename compatible_integer<T, 8>::type, Endianness>(is);
	} else if(bits == 16) {
		return load<typename compatible_integer<T, 16>::type, Endianness>(is);
	} else if(bits == 32) {
		return load<typename compatible_integer<T, 32>::type, Endianness>(is);
	} else {
		return load<typename compatible_integer<T, 64>::type, Endianness>(is);
	}
}